

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Runtime::LogSymbols(Runtime *this,SymbolList *symbolList)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  const_iterator symbol;
  SymbolListCItr symbol_00;
  bool bVar5;
  String symbolText;
  String local_50;
  
  uVar1 = 0;
  LogWriteLine(Info,"\nSymbols:\n====================");
  symbol_00._M_current =
       (symbolList->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
       _M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  if (symbol_00._M_current !=
      (symbolList->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar4 = (symbol_00._M_current)->columnNumber;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (symbol_00._M_current !=
      (symbolList->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
    uVar1 = 0;
    do {
      if (bVar2) {
        if (1 < (symbol_00._M_current)->columnNumber - uVar4) {
          uVar3 = 1;
          do {
            LogWrite(Info," ");
            uVar3 = uVar3 + 1;
          } while (uVar3 < (symbol_00._M_current)->columnNumber - uVar4);
        }
        bVar2 = false;
      }
      WriteSymbol(symbol_00,&local_50);
      LogWrite(Info,local_50._M_dataplus._M_p);
      bVar5 = (symbol_00._M_current)->type == NewLine;
      if (bVar5) {
        bVar2 = true;
      }
      uVar1 = uVar1 + bVar5;
      symbol_00._M_current = symbol_00._M_current + 1;
    } while (symbol_00._M_current !=
             (symbolList->
             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  LogWrite(Info,"\nLine Count: %i\n\n",(ulong)uVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    MemFree(local_50._M_dataplus._M_p,
            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Runtime::LogSymbols(const SymbolList & symbolList) const
	{
		LogWriteLine(LogLevel::Info, "\nSymbols:\n====================");
		bool newLine = true;

		// Store offset of first symbol
		auto offset = 0;
		if (!symbolList.empty())
			offset = symbolList.begin()->columnNumber;

		int lineCount = 0;

		String symbolText;

		// Iterate through the symbol list and write everything to the log
		for (auto symbol = symbolList.begin(); symbol != symbolList.end(); ++symbol)
		{
			// Write indentation at each new line
			if (newLine)
			{
				for (uint32_t i = 1; i < symbol->columnNumber - offset; ++i)
					LogWrite(LogLevel::Info, " ");
				newLine = false;
			}

			// Write out / lot symbols
			WriteSymbol(symbol, symbolText);
			LogWrite(LogLevel::Info, symbolText.c_str());

			// Special handling for newlines
			if (symbol->type == SymbolType::NewLine)
			{
				newLine = true;
				++lineCount;
			}

		}
		LogWrite(LogLevel::Info, "\nLine Count: %i\n\n", lineCount);
	}